

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptMapIterator * __thiscall
Js::JavascriptLibrary::CreateMapIterator
          (JavascriptLibrary *this,JavascriptMap *map,JavascriptMapIteratorKind kind)

{
  code *pcVar1;
  bool bVar2;
  DynamicType **ppDVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptMapIterator *this_00;
  TrackAllocData local_48;
  JavascriptMapIteratorKind local_1c;
  JavascriptMap *pJStack_18;
  JavascriptMapIteratorKind kind_local;
  JavascriptMap *map_local;
  JavascriptLibrary *this_local;
  
  local_1c = kind;
  pJStack_18 = map;
  map_local = (JavascriptMap *)this;
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->mapIteratorType);
  if (*ppDVar3 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1ba9,"(mapIteratorType)","Where\'s mapIteratorType");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&JavascriptMapIterator::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1baa);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_48);
  this_00 = (JavascriptMapIterator *)new<Memory::Recycler>(0x40,pRVar5,0x43c4b0);
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->mapIteratorType);
  JavascriptMapIterator::JavascriptMapIterator(this_00,*ppDVar3,pJStack_18,local_1c);
  return this_00;
}

Assistant:

JavascriptMapIterator* JavascriptLibrary::CreateMapIterator(JavascriptMap* map, JavascriptMapIteratorKind kind)
    {
        AssertMsg(mapIteratorType, "Where's mapIteratorType");
        return RecyclerNew(this->GetRecycler(), JavascriptMapIterator, mapIteratorType, map, kind);
    }